

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.cpp
# Opt level: O2

string * helper::int_to_hex<unsigned_char>(string *__return_storage_ptr__,u8 i)

{
  long lVar1;
  ostream *this;
  stringstream stream;
  undefined1 local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  this = std::operator<<(local_188,0x30);
  lVar1 = *(long *)this;
  *(undefined8 *)(this + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(this + lVar1 + 0x18) = *(uint *)(this + lVar1 + 0x18) & 0xffffffb5 | 8;
  std::ostream::operator<<(this,(uint)i);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

std::string int_to_hex( u8 i )
	{
		std::stringstream stream;
		stream << std::setfill( '0' ) << std::setw( 2 )
			<< std::hex << static_cast<int>( i );
		return stream.str();
	}